

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

HighsDomainChange __thiscall HighsDomain::backtrack(HighsDomain *this)

{
  pointer *ppiVar1;
  bool bVar2;
  Reason reason;
  pointer pHVar3;
  pointer ppVar4;
  pointer pRVar5;
  pointer pRVar6;
  pointer piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  vector<int,_std::allocator<int>_> *pvVar13;
  long lVar14;
  undefined8 uVar15;
  double dVar16;
  HighsDomainChange HVar17;
  HighsDomainChange local_40;
  
  uVar10 = (ulong)((long)(this->domchgstack_).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4;
  bVar2 = this->infeasible_;
  reason = this->infeasible_reason;
  iVar9 = (int)uVar10;
  if ((bVar2 == true) && (this->infeasible_pos == iVar9)) {
    this->infeasible_ = false;
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
  }
  uVar10 = uVar10 & 0xffffffff;
  lVar14 = uVar10 * 0x10 + -8;
  lVar8 = 0;
  do {
    lVar12 = lVar8;
    iVar11 = (int)lVar12;
    if (iVar9 + iVar11 < 1) goto LAB_002a4964;
    pHVar3 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar4 = (this->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_40.boundval = *(double *)((long)ppVar4 + lVar14 + -8);
    local_40.boundtype = *(HighsBoundType *)((long)&pHVar3->boundval + lVar14 + 4);
    pvVar13 = &this->colUpperPos_;
    if (local_40.boundtype == kLower) {
      pvVar13 = &this->colLowerPos_;
    }
    (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[*(int *)((long)&pHVar3->boundval + lVar14)] = *(int *)((long)&ppVar4->first + lVar14);
    local_40.column = *(HighsInt *)((long)&pHVar3->boundval + lVar14);
    doChangeBound(this,&local_40);
    if ((this->infeasible_ == true) && ((uVar10 - 1) + lVar12 == (ulong)(uint)this->infeasible_pos))
    {
      this->infeasible_ = false;
      (this->infeasible_reason).type = -2;
      (this->infeasible_reason).index = 0;
    }
    lVar14 = lVar14 + -0x10;
    lVar8 = lVar12 + -1;
  } while ((this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10 + lVar12 + -1].type != -1);
  ppiVar1 = &(this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar1 = *ppiVar1 + -1;
LAB_002a4964:
  if (bVar2 != false) {
    markPropagateCut(this,reason);
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
    this->infeasible_ = false;
  }
  pRVar5 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar6 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar12 = (long)(iVar9 + -1) + 1 + lVar12;
      lVar12 < (int)((ulong)((long)pRVar5 - (long)pRVar6) >> 3); lVar12 = lVar12 + 1) {
    markPropagateCut(this,(this->domchgreason_).
                          super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar12]);
  }
  if (iVar9 + iVar11 < 1) {
    pHVar3 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->domchgstack_).
        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_finish != pHVar3) {
      (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_finish = pHVar3;
    }
    ppVar4 = (this->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->prevboundval_).
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish != ppVar4) {
      (this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar4;
    }
    pRVar5 = (this->domchgreason_).
             super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->domchgreason_).
        super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar5) {
      (this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish = pRVar5;
    }
    piVar7 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = 0xffffffff;
    dVar16 = 0.0;
    if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar7) {
      (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar7;
    }
  }
  else {
    uVar10 = (ulong)((iVar11 + iVar9) - 1);
    pHVar3 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar16 = pHVar3[uVar10].boundval;
    uVar15._0_4_ = pHVar3[uVar10].column;
    uVar15._4_4_ = pHVar3[uVar10].boundtype;
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::erase
              (&this->domchgstack_,pHVar3 + uVar10,
               (this->domchgstack_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::resize
              (&this->domchgreason_,uVar10);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&this->prevboundval_,uVar10);
  }
  HVar17.column = (int)uVar15;
  HVar17.boundtype = (int)((ulong)uVar15 >> 0x20);
  HVar17.boundval = dVar16;
  return HVar17;
}

Assistant:

HighsDomainChange HighsDomain::backtrack() {
  HighsInt k = HighsInt(domchgstack_.size()) - 1;
  bool old_infeasible = infeasible_;
  Reason old_reason = infeasible_reason;

  if (infeasible_ && infeasible_pos == HighsInt(domchgstack_.size())) {
    assert(old_infeasible);
    assert(k == HighsInt(domchgstack_.size()) - 1);
    infeasible_ = false;
    infeasible_reason = Reason::unspecified();
  }
  while (k >= 0) {
    double prevbound = prevboundval_[k].first;
    HighsInt prevpos = prevboundval_[k].second;
    assert(prevpos < k);

    mipsolver->mipdata_->debugSolution.boundChangeRemoved(*this,
                                                          domchgstack_[k]);

    if (domchgstack_[k].boundtype == HighsBoundType::kLower) {
      assert(colLowerPos_[domchgstack_[k].column] == k);
      colLowerPos_[domchgstack_[k].column] = prevpos;
    } else {
      assert(colUpperPos_[domchgstack_[k].column] == k);
      colUpperPos_[domchgstack_[k].column] = prevpos;
    }

    // change back to global bound
    doChangeBound(
        {prevbound, domchgstack_[k].column, domchgstack_[k].boundtype});

    if (infeasible_ && infeasible_pos == k) {
      assert(old_infeasible);
      assert(k == HighsInt(domchgstack_.size()) - 1);
      infeasible_ = false;
      infeasible_reason = Reason::unspecified();
    }

    if (domchgreason_[k].type == Reason::kBranching) {
      branchPos_.pop_back();
      break;
    }

    --k;
  }

  if (old_infeasible) {
    markPropagateCut(old_reason);
    infeasible_reason = Reason::unspecified();
    infeasible_ = false;
  }

  HighsInt numreason = domchgreason_.size();
  for (HighsInt i = k + 1; i < numreason; ++i)
    markPropagateCut(domchgreason_[i]);

  if (k < 0) {
    domchgstack_.clear();
    prevboundval_.clear();
    domchgreason_.clear();
    branchPos_.clear();
    return HighsDomainChange({0.0, -1, HighsBoundType::kLower});
  }

  HighsDomainChange backtrackboundchg = domchgstack_[k];
  domchgstack_.erase(domchgstack_.begin() + k, domchgstack_.end());
  domchgreason_.resize(k);
  prevboundval_.resize(k);

  return backtrackboundchg;
}